

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

real __thiscall
fasttext::Model::oneVsAll(Model *this,vector<int,_std::allocator<int>_> *targets,real lr)

{
  undefined8 in_RSI;
  Model *in_RDI;
  real in_XMM0_Da;
  real rVar1;
  vector<int,_std::allocator<int>_> *unaff_retaddr;
  bool isMatch;
  int32_t i;
  real loss;
  int local_1c;
  float local_18;
  Model *this_00;
  
  local_18 = 0.0;
  this_00 = in_RDI;
  for (local_1c = 0; local_1c < in_RDI->osz_; local_1c = local_1c + 1) {
    utils::contains<int>(unaff_retaddr,(int *)this_00);
    rVar1 = binaryLogistic(this_00,(int32_t)((ulong)in_RSI >> 0x20),SUB81((ulong)in_RSI >> 0x18,0),
                           in_XMM0_Da);
    local_18 = rVar1 + local_18;
  }
  return local_18;
}

Assistant:

real Model::oneVsAll(const std::vector<int32_t>& targets, real lr) {
	real loss = 0.0;
	for (int32_t i = 0; i < osz_; i++) {
		bool isMatch = utils::contains(targets, i);
		loss += binaryLogistic(i, isMatch, lr);
	}

	return loss;
}